

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_MinimumValue_Test::TestBody
          (ElementsTransactionApi_EstimateFee_MinimumValue_Test *this)

{
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  initializer_list<cfd::UtxoData> __l_00;
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_type sVar4;
  size_t sVar5;
  Amount *expected_predicate_value;
  Amount AVar6;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ByteData tx;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  uint64_t effective_fee_rate2;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo1;
  string tx_hex;
  ElementsAddressFactory factory;
  undefined4 in_stack_ffffffffffffe078;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffe07c;
  undefined4 in_stack_ffffffffffffe080;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffe084;
  undefined4 in_stack_ffffffffffffe088;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe08c;
  ElementsUtxoAndOption *in_stack_ffffffffffffe090;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffe098;
  ElementsUtxoAndOption *in_stack_ffffffffffffe0a0;
  undefined4 in_stack_ffffffffffffe0a8;
  undefined4 in_stack_ffffffffffffe0ac;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe0b0;
  undefined4 in_stack_ffffffffffffe0b8;
  NetType in_stack_ffffffffffffe0bc;
  undefined4 in_stack_ffffffffffffe0c0;
  undefined4 in_stack_ffffffffffffe0c4;
  undefined8 in_stack_ffffffffffffe0c8;
  undefined7 in_stack_ffffffffffffe0d0;
  undefined1 in_stack_ffffffffffffe0d7;
  Amount *in_stack_ffffffffffffe0d8;
  UtxoData *in_stack_ffffffffffffe0e0;
  UtxoData *in_stack_ffffffffffffe0e8;
  UtxoData *in_stack_ffffffffffffe0f0;
  undefined4 in_stack_ffffffffffffe0f8;
  undefined1 in_stack_ffffffffffffe0fc;
  undefined1 in_stack_ffffffffffffe0fd;
  undefined1 in_stack_ffffffffffffe0fe;
  undefined1 in_stack_ffffffffffffe0ff;
  int exponent;
  undefined8 in_stack_ffffffffffffe138;
  int minimum_bits;
  undefined8 in_stack_ffffffffffffe140;
  undefined7 in_stack_ffffffffffffe148;
  undefined1 in_stack_ffffffffffffe14f;
  undefined8 **local_1e18;
  undefined8 **local_1df8;
  AssertHelper local_1da8;
  Message local_1da0;
  undefined4 local_1d94;
  AssertionResult local_1d90;
  uint local_1d7c;
  AssertHelper local_1d78;
  Message local_1d70;
  undefined4 local_1d68;
  uint32_t local_1d64;
  AssertionResult local_1d60;
  AssertHelper local_1d50;
  Message local_1d48;
  undefined4 local_1d3c;
  size_t local_1d38;
  AssertionResult local_1d30;
  AssertHelper local_1d20;
  Message local_1d18 [4];
  AssertHelper local_1cf8;
  Message local_1cf0;
  OutPoint local_1ce8;
  AssertHelper local_1cc0;
  Message local_1cb8;
  SigHashType local_1cb0;
  allocator local_1ca1;
  string local_1ca0;
  Privkey local_1c80;
  allocator local_1c59;
  string local_1c58;
  Pubkey local_1c38;
  OutPoint local_1c20;
  ByteData local_1bf8;
  string local_1be0;
  AssertHelper local_1bc0;
  Message local_1bb8;
  ConfidentialValue local_1bb0;
  byte local_1b81;
  AssertionResult local_1b80;
  string local_1b70;
  AssertHelper local_1b50;
  Message local_1b48;
  ConfidentialValue local_1b40;
  undefined1 local_1b11;
  AssertionResult local_1b10;
  AssertHelper local_1b00;
  Message local_1af8;
  undefined4 local_1aec;
  size_type local_1ae8;
  AssertionResult local_1ae0;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_1ad0;
  AssertHelper local_1ab8;
  Message local_1ab0 [4];
  AssertHelper local_1a90;
  Message local_1a88;
  undefined4 local_1a7c;
  int64_t local_1a78;
  AssertionResult local_1a70;
  AssertHelper local_1a60;
  Message local_1a58;
  undefined4 local_1a4c;
  int64_t local_1a48;
  AssertionResult local_1a40;
  AssertHelper local_1a30;
  Message local_1a28;
  undefined4 local_1a1c;
  int64_t local_1a18;
  AssertionResult local_1a10;
  SigHashType *local_1a00;
  undefined1 local_19f8;
  string local_19f0 [8];
  OutPoint *in_stack_ffffffffffffe618;
  undefined8 in_stack_ffffffffffffe620;
  undefined1 in_stack_ffffffffffffe62f;
  SigHashType *sighash_type;
  undefined1 uVar10;
  undefined7 in_stack_ffffffffffffe639;
  Pubkey *in_stack_ffffffffffffe640;
  OutPoint *in_stack_ffffffffffffe648;
  ConfidentialTransactionContext *in_stack_ffffffffffffe650;
  Amount local_19a8;
  Amount local_1998;
  undefined8 local_1988;
  undefined8 local_1980;
  AssertHelper local_1978;
  Message local_1970 [2];
  undefined1 **local_1960;
  undefined8 *local_1958 [16];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe728;
  ConfidentialTransactionContext *in_stack_ffffffffffffe730;
  undefined1 **local_1468;
  undefined8 local_1460;
  ConfidentialTransaction local_1440 [3];
  undefined1 **local_1380;
  undefined8 *local_1378 [167];
  undefined1 **local_e40;
  undefined8 local_e38;
  allocator local_8d9;
  string local_8d8;
  ConfidentialValue local_8b8;
  allocator local_889;
  string local_888;
  BlindFactor local_868;
  allocator local_841;
  string local_840;
  BlindFactor local_820;
  allocator local_7f9;
  string local_7f8;
  ConfidentialAssetId local_7d8;
  Amount local_7b0;
  allocator local_799;
  string local_798 [32];
  Address local_778;
  allocator local_5f9;
  string local_5f8;
  Script local_5d8;
  allocator local_599;
  string local_598;
  Txid local_578;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_320 [32];
  int64_t local_300;
  undefined1 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2e8;
  ConfidentialAssetId local_2e0 [11];
  BlindFactor local_108;
  BlindFactor local_e8;
  ConfidentialValue local_c8 [2];
  allocator local_51;
  string local_50 [80];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)CONCAT44(in_stack_ffffffffffffe0c4,in_stack_ffffffffffffe0c0)
             ,in_stack_ffffffffffffe0bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000"
             ,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe0e0);
  local_558 = 0;
  local_2e8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_598,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_599);
  cfd::core::Txid::Txid(&local_578,&local_598);
  cfd::core::Txid::operator=(&local_530,&local_578);
  cfd::core::Txid::~Txid((Txid *)0x2c2f36);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5f8,"0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b",&local_5f9);
  cfd::core::Script::Script(&local_5d8,&local_5f8);
  cfd::core::Script::operator=(local_508,&local_5d8);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld",&local_799);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
  cfd::core::Address::operator=(&local_498,&local_778);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::operator=
            (local_320,"wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)");
  cfd::core::Amount::Amount(&local_7b0,0x5f5e1c8);
  local_2f8 = local_7b0.ignore_check_;
  local_300 = local_7b0.amount_;
  local_2f0 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7f8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_7f9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7d8,&local_7f8);
  cfd::core::ConfidentialAssetId::operator=(local_2e0,&local_7d8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2c3134);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_840,"ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339"
             ,&local_841);
  cfd::core::BlindFactor::BlindFactor(&local_820,&local_840);
  cfd::core::BlindFactor::operator=(&local_108,&local_820);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2c31bc);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_888,"80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a"
             ,&local_889);
  cfd::core::BlindFactor::BlindFactor(&local_868,&local_888);
  cfd::core::BlindFactor::operator=(&local_e8,&local_868);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2c3244);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8d8,
             "085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3",&local_8d9);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_8b8,&local_8d8);
  cfd::core::ConfidentialValue::operator=(local_c8,&local_8b8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2c32cc);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffe090);
  cfd::UtxoData::operator=
            ((UtxoData *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             (UtxoData *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078));
  local_1380 = (undefined1 **)local_1378;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098);
  local_e40 = (undefined1 **)local_1378;
  local_e38 = 1;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2c335c);
  __l._M_array._4_4_ = in_stack_ffffffffffffe0bc;
  __l._M_array._0_4_ = in_stack_ffffffffffffe0b8;
  __l._M_len._0_4_ = in_stack_ffffffffffffe0c0;
  __l._M_len._4_4_ = in_stack_ffffffffffffe0c4;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffe0b0,__l,
         (allocator_type *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8));
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2c3390);
  local_1df8 = &local_e40;
  do {
    local_1df8 = local_1df8 + -0xa7;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)
               CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
  } while (local_1df8 != local_1378);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             (string *)CONCAT44(in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078));
  local_1960 = (undefined1 **)local_1958;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8);
  local_1468 = (undefined1 **)local_1958;
  local_1460 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2c344e);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffe0bc;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffe0b8;
  __l_00._M_len._0_4_ = in_stack_ffffffffffffe0c0;
  __l_00._M_len._4_4_ = in_stack_ffffffffffffe0c4;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffe0b0,__l_00,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2c3482);
  local_1e18 = &local_1468;
  do {
    local_1e18 = local_1e18 + -0x9e;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
    minimum_bits = (int)in_stack_ffffffffffffe140;
    uVar10 = (undefined1)((ulong)in_stack_ffffffffffffe0c8 >> 0x38);
    exponent = (int)in_stack_ffffffffffffe138;
  } while (local_1e18 != local_1958);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
    }
  }
  else {
    testing::Message::Message(local_1970);
    testing::internal::AssertHelper::AssertHelper
              (&local_1978,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1978,local_1970);
    testing::internal::AssertHelper::~AssertHelper(&local_1978);
    testing::Message::~Message((Message *)0x2c3b45);
  }
  local_1980 = 0x3fb999999999999a;
  local_1988 = 100;
  cfd::core::Amount::Amount(&local_1998);
  cfd::core::Amount::Amount(&local_19a8);
  cfd::core::Amount::Amount((Amount *)&stack0xffffffffffffe648);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi
            ((ElementsTransactionApi *)&stack0xffffffffffffe647);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_19f0,&local_1440[0].super_AbstractTransaction);
  this_00 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  uVar9 = 0x24;
  uVar8 = 0;
  uVar7 = 1;
  expected_predicate_value = &local_19a8;
  AVar6 = cfd::api::ElementsTransactionApi::EstimateFee
                    ((ElementsTransactionApi *)
                     CONCAT17(in_stack_ffffffffffffe0ff,
                              CONCAT16(in_stack_ffffffffffffe0fe,
                                       CONCAT15(in_stack_ffffffffffffe0fd,
                                                CONCAT14(in_stack_ffffffffffffe0fc,
                                                         in_stack_ffffffffffffe0f8)))),
                     (string *)in_stack_ffffffffffffe0f0,
                     (vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                      *)in_stack_ffffffffffffe0e8,(ConfidentialAssetId *)in_stack_ffffffffffffe0e0,
                     in_stack_ffffffffffffe0d8,
                     (Amount *)CONCAT17(in_stack_ffffffffffffe0d7,in_stack_ffffffffffffe0d0),
                     (bool)uVar10,
                     (double)CONCAT44(in_stack_ffffffffffffe0c4,in_stack_ffffffffffffe0c0),exponent,
                     minimum_bits,
                     (uint32_t *)CONCAT17(in_stack_ffffffffffffe14f,in_stack_ffffffffffffe148));
  local_1a00 = (SigHashType *)AVar6.amount_;
  local_19f8 = AVar6.ignore_check_;
  sighash_type = local_1a00;
  uVar10 = local_19f8;
  local_1998.amount_ = (int64_t)local_1a00;
  local_1998.ignore_check_ = (bool)local_19f8;
  std::__cxx11::string::~string(local_19f0);
  local_1a18 = cfd::core::Amount::GetSatoshiValue(&local_1998);
  local_1a1c = 99;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe098,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a10);
  if (!bVar1) {
    testing::Message::Message(&local_1a28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c3db8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a30,&local_1a28);
    testing::internal::AssertHelper::~AssertHelper(&local_1a30);
    testing::Message::~Message((Message *)0x2c3e1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c3e73);
  local_1a48 = cfd::core::Amount::GetSatoshiValue((Amount *)&stack0xffffffffffffe648);
  local_1a4c = 0x5c;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe098,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a40);
  if (!bVar1) {
    testing::Message::Message(&local_1a58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c3f41);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a60,&local_1a58);
    testing::internal::AssertHelper::~AssertHelper(&local_1a60);
    testing::Message::~Message((Message *)0x2c3fa4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c3ffc);
  local_1a78 = cfd::core::Amount::GetSatoshiValue(&local_19a8);
  local_1a7c = 7;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe098,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a70);
  if (!bVar1) {
    testing::Message::Message(&local_1a88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c40ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a90,&local_1a88);
    testing::internal::AssertHelper::~AssertHelper(&local_1a90);
    testing::Message::~Message((Message *)0x2c412d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c4182);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2c418f);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      expected_predicate_value = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffe0f0,
                 (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                  *)in_stack_ffffffffffffe0e8,(int64_t)in_stack_ffffffffffffe0e0,
                 (int)((ulong)in_stack_ffffffffffffe0d8 >> 0x20),(int)in_stack_ffffffffffffe0d8,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)
                 CONCAT17(in_stack_ffffffffffffe0d7,in_stack_ffffffffffffe0d0));
    }
  }
  else {
    testing::Message::Message(local_1ab0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfc,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1ab8,local_1ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ab8);
    testing::Message::~Message((Message *)0x2c42c4);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&local_1ad0,local_1440);
  local_1ae8 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(&local_1ad0);
  local_1aec = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)in_stack_ffffffffffffe098,(char *)this_00,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ae0);
  if (!bVar1) {
    testing::Message::Message(&local_1af8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c43e9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b00,&local_1af8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b00);
    testing::Message::~Message((Message *)0x2c444c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c44a4);
  sVar4 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(&local_1ad0);
  if (sVar4 == 2) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_1ad0,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffe07c,uVar7));
    local_1b11 = cfd::core::ConfidentialValue::HasBlinding(&local_1b40);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe084,uVar8),
               (bool *)CONCAT44(in_stack_ffffffffffffe07c,uVar7),(type *)0x2c451d);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2c452c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b10);
    if (!bVar1) {
      testing::Message::Message(&local_1b48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1b70,(internal *)&local_1b10,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x100,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b50,&local_1b48);
      testing::internal::AssertHelper::~AssertHelper(&local_1b50);
      std::__cxx11::string::~string((string *)&local_1b70);
      testing::Message::~Message((Message *)0x2c464e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c46c9);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_1ad0,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffe07c,uVar7));
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_1bb0);
    local_1b81 = ~bVar1 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe084,uVar8),
               (bool *)CONCAT44(in_stack_ffffffffffffe07c,uVar7),(type *)0x2c472e);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2c473d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b80);
    if (!bVar1) {
      testing::Message::Message(&local_1bb8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1be0,(internal *)&local_1b80,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1bc0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x101,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1bc0,&local_1bb8);
      testing::internal::AssertHelper::~AssertHelper(&local_1bc0);
      std::__cxx11::string::~string((string *)&local_1be0);
      testing::Message::~Message((Message *)0x2c485f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c48d7);
  }
  cfd::core::ByteData::ByteData(&local_1bf8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1c20,&local_530,local_510);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c58,
                 "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6",&local_1c59);
      cfd::core::Pubkey::Pubkey(&local_1c38,&local_1c58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1ca0,"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1",
                 &local_1ca1);
      cfd::core::Privkey::FromWif(&local_1c80,&local_1ca0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1cb0);
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640,
                 (Privkey *)CONCAT71(in_stack_ffffffffffffe639,uVar10),sighash_type,
                 (bool)in_stack_ffffffffffffe62f);
      cfd::core::Privkey::~Privkey((Privkey *)0x2c4a40);
      std::__cxx11::string::~string((string *)&local_1ca0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ca1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2c4a67);
      std::__cxx11::string::~string((string *)&local_1c58);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c59);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2c4a8e);
    }
  }
  else {
    testing::Message::Message(&local_1cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x109,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6\"), Privkey::FromWif( \"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1cc0,&local_1cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cc0);
    testing::Message::~Message((Message *)0x2c4c20);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1ce8,&local_530,local_510);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffe620,
                 in_stack_ffffffffffffe618);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2c4ce9);
    }
  }
  else {
    testing::Message::Message(&local_1cf0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10a,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1cf8,&local_1cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_1cf8);
    testing::Message::~Message((Message *)0x2c4db3);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffe08c,uVar9));
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffe084,uVar8),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffe07c,uVar7));
      cfd::core::ByteData::~ByteData((ByteData *)0x2c4e70);
    }
  }
  else {
    testing::Message::Message(local_1d18);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10c,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1d20,local_1d18);
    testing::internal::AssertHelper::~AssertHelper(&local_1d20);
    testing::Message::~Message((Message *)0x2c4f17);
  }
  sVar5 = cfd::core::ByteData::GetDataSize(&local_1bf8);
  if (((sVar5 != 0xcdf) && (sVar5 = cfd::core::ByteData::GetDataSize(&local_1bf8), sVar5 != 0xcde))
     && (sVar5 = cfd::core::ByteData::GetDataSize(&local_1bf8), sVar5 != 0xce0)) {
    local_1d38 = cfd::core::ByteData::GetDataSize(&local_1bf8);
    local_1d3c = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((char *)in_stack_ffffffffffffe098,(char *)this_00,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d30);
    if (!bVar1) {
      testing::Message::Message(&local_1d48);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c5081);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x10f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d50,&local_1d48);
      testing::internal::AssertHelper::~AssertHelper(&local_1d50);
      testing::Message::~Message((Message *)0x2c50de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c5133);
  }
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1440);
  if ((uVar2 != 0x3dc) &&
     (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1440), uVar2 != 0x3db)) {
    local_1d64 = cfd::core::ConfidentialTransaction::GetVsize(local_1440);
    local_1d68 = 0x3dc;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffe098,(char *)this_00,
               (uint *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d60);
    if (!bVar1) {
      testing::Message::Message(&local_1d70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c5238);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x113,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d78,&local_1d70);
      testing::internal::AssertHelper::~AssertHelper(&local_1d78);
      testing::Message::~Message((Message *)0x2c5295);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c52ea);
  }
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1440);
  local_1d7c = (uVar2 * (int)local_1988) / 1000;
  if ((local_1d7c != 0x62) && (local_1d7c != 0x61)) {
    local_1d94 = 0x62;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffe098,(char *)this_00,
               (uint *)CONCAT44(in_stack_ffffffffffffe08c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d90);
    if (!bVar1) {
      testing::Message::Message(&local_1da0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2c53db);
      testing::internal::AssertHelper::AssertHelper
                (&local_1da8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x118,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1da8,&local_1da0);
      testing::internal::AssertHelper::~AssertHelper(&local_1da8);
      testing::Message::~Message((Message *)0x2c5438);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2c548d);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x2c54ae);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)this_00);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffe084,uVar8));
  std::__cxx11::string::~string(local_50);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2c5523);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_MinimumValue)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string tx_hex = "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000";

  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld");
  utxo1.descriptor = "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)";
  utxo1.amount = Amount(int64_t{100000200});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.asset_blind_factor = BlindFactor("ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339");
  utxo1.amount_blind_factor = BlindFactor("80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a");
  utxo1.value_commitment = ConfidentialValue("085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3");
  ElementsUtxoAndOption eutxo1;
  eutxo1.utxo = utxo1;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1
  };

  ConfidentialTransactionContext txc(tx_hex);

  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 99);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 92);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 7);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 2);
  if (txouts.size() == 2) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6"),
      Privkey::FromWif(
          "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 3295) && (tx.GetDataSize() != 3294) && (tx.GetDataSize() != 3296)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 988) && (txc.GetVsize() != 987)) {
    EXPECT_EQ(txc.GetVsize(), 988);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  if ((minimum_fee != 98) && (minimum_fee != 97)) {
    EXPECT_EQ(minimum_fee, 98);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}